

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O1

void __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::BacktrackingTokenStream
          (BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this)

{
  _Rb_tree_header *p_Var1;
  StreamBlock *pSVar2;
  long lVar3;
  
  (this->super_TokenStream<SGParser::Generator::RegExprParseToken>)._vptr_TokenStream =
       (_func_int **)&PTR__BacktrackingTokenStream_00164d30;
  this->pSourceStream = (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0;
  pSVar2 = (StreamBlock *)operator_new(0x1018);
  lVar3 = 4;
  do {
    *(undefined8 *)((long)pSVar2->Tokens + lVar3 + -4) = 1;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x1004);
  pSVar2->Index = 0;
  pSVar2->Count = 0;
  pSVar2->pNext = (StreamBlock *)0x0;
  this->pFirstBlock = pSVar2;
  this->pThisBlock = pSVar2;
  this->ThisPos = 0;
  this->RememberLength = 1;
  p_Var1 = &(this->Markers)._M_t._M_impl.super__Rb_tree_header;
  (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->LengthLeft = 0;
  this->Pos = 0;
  this->SourceEOFFlag = false;
  (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

BacktrackingTokenStream<Token>::BacktrackingTokenStream()
    : pSourceStream{nullptr},
      pFirstBlock{new StreamBlock}, // Allocate 1 stream block
      pThisBlock{pFirstBlock},
      ThisPos{0u},
      RememberLength{1u},
      LengthLeft{0u},
      Pos{0u},
      SourceEOFFlag{false} {
}